

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Commands.cpp
# Opt level: O0

void __thiscall RCONConsoleCommand::trigger(RCONConsoleCommand *this,string_view parameters)

{
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *this_00;
  bool bVar1;
  ostream *poVar2;
  reference ppSVar3;
  Server **server;
  const_iterator __end1;
  const_iterator __begin1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *__range1;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> local_40 [24];
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *local_28;
  vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *servers;
  RCONConsoleCommand *this_local;
  string_view parameters_local;
  
  parameters_local._M_len = (size_t)parameters._M_str;
  this_local = (RCONConsoleCommand *)parameters._M_len;
  servers = (vector<RenX::Server_*,_std::allocator<RenX::Server_*>_> *)this;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Too Few Parameters. Syntax: rcon <input>"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  RenX::getCore();
  RenX::Core::getServers();
  local_28 = local_40;
  bVar1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::empty(local_28);
  this_00 = local_28;
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)&std::cout,"Error: Not connected to any Renegade X servers."
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    __end1 = std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::begin(local_28);
    server = (Server **)std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::end(this_00);
    while (bVar1 = __gnu_cxx::
                   operator==<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                             (&__end1,(__normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                                       *)&server), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppSVar3 = __gnu_cxx::
                __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
                ::operator*(&__end1);
      RenX::Server::send(*ppSVar3,this_local,parameters_local._M_len);
      __gnu_cxx::
      __normal_iterator<RenX::Server_*const_*,_std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>_>
      ::operator++(&__end1);
    }
  }
  std::vector<RenX::Server_*,_std::allocator<RenX::Server_*>_>::~vector(local_40);
  return;
}

Assistant:

void RCONConsoleCommand::trigger(std::string_view parameters) {
	if (parameters.empty()) {
		std::cout << "Error: Too Few Parameters. Syntax: rcon <input>" << std::endl;
	}

	const auto& servers = RenX::getCore()->getServers();
	if (servers.empty()) {
		std::cout << "Error: Not connected to any Renegade X servers." << std::endl;
		return;
	}

	for (const auto& server : servers) {
		server->send(parameters);
	}
}